

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_surface.cpp
# Opt level: O2

Reals __thiscall
Omega_h::get_curv_vert_curvatures
          (Omega_h *this,Mesh *mesh,LOs *curv_edge2edge,Reals *curv_edge_curvatures,
          LOs *curv_vert2vert)

{
  Int IVar1;
  void *extraout_RDX;
  Write<int> *this_00;
  Write<double> *this_01;
  Write<int> *this_02;
  Reals RVar2;
  Write<int> local_90;
  Write<double> local_80;
  Write<int> local_70;
  Write<int> local_60;
  Write<double> local_50;
  Write<int> local_40;
  
  IVar1 = Mesh::dim(mesh);
  if (IVar1 == 3) {
    Write<int>::Write(&local_40,&curv_edge2edge->write_);
    this_01 = &local_50;
    Write<double>::Write(this_01,&curv_edge_curvatures->write_);
    this_00 = &local_60;
    Write<int>::Write(this_00,&curv_vert2vert->write_);
    this_02 = &local_40;
    get_curv_vert_curvatures_dim<3>(this,mesh,(LOs *)this_02,(Reals *)this_01,(LOs *)this_00);
  }
  else {
    IVar1 = Mesh::dim(mesh);
    if (IVar1 != 2) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_surface.cpp"
           ,0x243);
    }
    Write<int>::Write(&local_70,&curv_edge2edge->write_);
    this_01 = &local_80;
    Write<double>::Write(this_01,&curv_edge_curvatures->write_);
    this_00 = &local_90;
    Write<int>::Write(this_00,&curv_vert2vert->write_);
    this_02 = &local_70;
    get_curv_vert_curvatures_dim<2>(this,mesh,(LOs *)this_02,(Reals *)this_01,(LOs *)this_00);
  }
  Write<int>::~Write(this_00);
  Write<double>::~Write(this_01);
  Write<int>::~Write(this_02);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals get_curv_vert_curvatures(Mesh* mesh, LOs curv_edge2edge,
    Reals curv_edge_curvatures, LOs curv_vert2vert) {
  if (mesh->dim() == 3) {
    return get_curv_vert_curvatures_dim<3>(
        mesh, curv_edge2edge, curv_edge_curvatures, curv_vert2vert);
  }
  if (mesh->dim() == 2) {
    return get_curv_vert_curvatures_dim<2>(
        mesh, curv_edge2edge, curv_edge_curvatures, curv_vert2vert);
  }
  OMEGA_H_NORETURN(Reals());
}